

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void freeobj(lua_State *L,GCObject *o)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t osize;
  long lVar3;
  TString *ts;
  
  switch(o->tt) {
  case '\x04':
    luaS_remove(L,(TString *)o);
    osize = (ulong)((int)(char)o->field_0xb + 1) + 0x18;
    break;
  case '\x05':
    luaH_free(L,(Table *)o);
    return;
  case '\x06':
    osize = (ulong)(byte)o->field_0xa * 8 + 0x20;
    break;
  case '\a':
    lVar3 = 0x20;
    if (*(ushort *)&o->field_0xa != 0) {
      lVar3 = (ulong)*(ushort *)&o->field_0xa * 0x10 + 0x28;
    }
    osize = (long)&(o[1].next)->next + lVar3;
    break;
  case '\b':
    luaE_freethread(L,(lua_State *)o);
    return;
  case '\t':
    if (o[1].next != (GCObject *)&o[1].tt) {
      luaF_unlinkupval((UpVal *)o);
    }
    osize = 0x28;
    break;
  case '\n':
    luaF_freeproto(L,(Proto *)o);
    return;
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    return;
  case '\x14':
    if (o->field_0xb == -3) {
      uVar1._0_1_ = o[2].tt;
      uVar1._1_1_ = o[2].marked;
      uVar1._2_6_ = *(undefined6 *)&o[2].field_0xa;
      uVar2._0_1_ = o[1].tt;
      uVar2._1_1_ = o[1].marked;
      uVar2._2_6_ = *(undefined6 *)&o[1].field_0xa;
      (*(code *)o[2].next)(uVar1,uVar2,(undefined1 *)((long)&(o[1].next)->next + 1),0);
    }
    osize = luaS_sizelngstr((size_t)o[1].next,(int)(char)o->field_0xb);
    break;
  default:
    if (o->tt != '&') {
      return;
    }
    osize = (ulong)(byte)o->field_0xa * 0x10 + 0x20;
  }
  luaM_free_(L,o,osize);
  return;
}

Assistant:

static void freeobj (lua_State *L, GCObject *o) {
  assert_code(l_mem newmem = gettotalbytes(G(L)) - objsize(o));
  switch (o->tt) {
    case LUA_VPROTO:
      luaF_freeproto(L, gco2p(o));
      break;
    case LUA_VUPVAL:
      freeupval(L, gco2upv(o));
      break;
    case LUA_VLCL: {
      LClosure *cl = gco2lcl(o);
      luaM_freemem(L, cl, sizeLclosure(cl->nupvalues));
      break;
    }
    case LUA_VCCL: {
      CClosure *cl = gco2ccl(o);
      luaM_freemem(L, cl, sizeCclosure(cl->nupvalues));
      break;
    }
    case LUA_VTABLE:
      luaH_free(L, gco2t(o));
      break;
    case LUA_VTHREAD:
      luaE_freethread(L, gco2th(o));
      break;
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      luaM_freemem(L, o, sizeudata(u->nuvalue, u->len));
      break;
    }
    case LUA_VSHRSTR: {
      TString *ts = gco2ts(o);
      luaS_remove(L, ts);  /* remove it from hash table */
      luaM_freemem(L, ts, sizestrshr(cast_uint(ts->shrlen)));
      break;
    }
    case LUA_VLNGSTR: {
      TString *ts = gco2ts(o);
      if (ts->shrlen == LSTRMEM)  /* must free external string? */
        (*ts->falloc)(ts->ud, ts->contents, ts->u.lnglen + 1, 0);
      luaM_freemem(L, ts, luaS_sizelngstr(ts->u.lnglen, ts->shrlen));
      break;
    }
    default: lua_assert(0);
  }
  lua_assert(gettotalbytes(G(L)) == newmem);
}